

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  __type _Var3;
  bool bVar4;
  Result RVar5;
  TargetType TVar6;
  int iVar7;
  PolicyStatus PVar8;
  long lVar9;
  cmGeneratorTarget *pcVar10;
  string *psVar11;
  ostream *poVar12;
  cmLinkInterfaceLibraries *libraries;
  cmLinkImplementationLibraries *libraries_00;
  char *pcVar13;
  long lVar14;
  cmGeneratorTarget *head;
  char *pcVar15;
  size_t i;
  cmGeneratorTarget *target;
  string propertyName;
  string linkedTargetsContent;
  string interfacePropertyName;
  allocator<char> local_201;
  string local_200;
  char *local_1e0;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_50;
  
  if (1 < ((long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&propertyName,
               "$<TARGET_PROPERTY:...> expression requires one or two parameters",
               (allocator<char> *)&linkedTargetsContent);
    reportError(context,(string *)&dagChecker,&propertyName);
    std::__cxx11::string::~string((string *)&propertyName);
    std::__cxx11::string::~string((string *)&dagChecker);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar7 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar7 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  target = context->HeadTarget;
  std::__cxx11::string::string
            ((string *)&propertyName,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  pbVar2 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  lVar14 = lVar9 >> 5;
  if (lVar14 == 1) {
    context->HadHeadSensitiveCondition = true;
    if (target != (cmGeneratorTarget *)0x0) {
      if (lVar9 == 0x40) goto LAB_002f8f1d;
      goto LAB_002f90e3;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkedTargetsContent,
               "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
               ,(allocator<char> *)&interfacePropertyName);
    reportError(context,(string *)&dagChecker,&linkedTargetsContent);
  }
  else if (lVar14 == 2) {
LAB_002f8f1d:
    if (pbVar2->_M_string_length != 0) {
      std::__cxx11::string::string((string *)&linkedTargetsContent,(string *)pbVar2);
      std::__cxx11::string::_M_assign((string *)&propertyName);
      bVar4 = cmGeneratorExpression::IsValidTargetName(&linkedTargetsContent);
      if (bVar4) {
        if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
             ::propALIASED_TARGET_abi_cxx11_ == '\0') &&
           (iVar7 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                         ::propALIASED_TARGET_abi_cxx11_), iVar7 != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                      ::propALIASED_TARGET_abi_cxx11_,"ALIASED_TARGET",
                     (allocator<char> *)&dagChecker);
          __cxa_atexit(std::__cxx11::string::~string,
                       &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                        ::propALIASED_TARGET_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                               ::propALIASED_TARGET_abi_cxx11_);
        }
        _Var3 = std::operator==(&propertyName,
                                &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                 ::propALIASED_TARGET_abi_cxx11_);
        if (_Var3) {
          bVar4 = cmMakefile::IsAlias(context->LG->Makefile,&linkedTargetsContent);
          if ((bVar4) &&
             (pcVar10 = cmLocalGenerator::FindGeneratorTargetToUse
                                  (context->LG,&linkedTargetsContent),
             pcVar10 != (cmGeneratorTarget *)0x0)) {
            psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar10);
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar11);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"",(allocator<char> *)&dagChecker);
          }
        }
        else {
          target = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&linkedTargetsContent);
          if (target != (cmGeneratorTarget *)0x0) {
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)&context->AllTargets,&target);
            std::__cxx11::string::~string((string *)&linkedTargetsContent);
            goto LAB_002f90e3;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dagChecker);
          poVar12 = std::operator<<((ostream *)&dagChecker,"Target \"");
          poVar12 = std::operator<<(poVar12,(string *)&linkedTargetsContent);
          std::operator<<(poVar12,"\" not found.");
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    (&interfacePropertyName,content);
          std::__cxx11::stringbuf::str();
          reportError(context,&interfacePropertyName,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&interfacePropertyName);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dagChecker);
        }
      }
      else {
        bVar4 = cmsys::RegularExpression::find
                          (&Evaluate::propertyNameValidator,propertyName._M_dataplus._M_p);
        if (bVar4) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    ((string *)&dagChecker,content);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&interfacePropertyName,"Target name not supported.",
                     (allocator<char> *)&local_200);
          reportError(context,(string *)&dagChecker,&interfacePropertyName);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    ((string *)&dagChecker,content);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&interfacePropertyName,"Target name and property name not supported."
                     ,(allocator<char> *)&local_200);
          reportError(context,(string *)&dagChecker,&interfacePropertyName);
        }
        std::__cxx11::string::~string((string *)&interfacePropertyName);
        std::__cxx11::string::~string((string *)&dagChecker);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      std::__cxx11::string::~string((string *)&linkedTargetsContent);
      goto LAB_002f9b41;
    }
    if (pbVar2[1]._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkedTargetsContent,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name and property name."
                 ,(allocator<char> *)&interfacePropertyName);
      reportError(context,(string *)&dagChecker,&linkedTargetsContent);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkedTargetsContent,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name.",
                 (allocator<char> *)&interfacePropertyName);
      reportError(context,(string *)&dagChecker,&linkedTargetsContent);
    }
  }
  else {
LAB_002f90e3:
    if (target == context->HeadTarget) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&context->SeenTargetProperties,&propertyName);
    }
    bVar4 = std::operator==(&propertyName,"SOURCES");
    if (bVar4) {
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->SourceSensitiveTargets,&target);
    }
    if (propertyName._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkedTargetsContent,
                 "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",
                 (allocator<char> *)&interfacePropertyName);
      reportError(context,(string *)&dagChecker,&linkedTargetsContent);
    }
    else {
      bVar4 = cmsys::RegularExpression::find
                        (&Evaluate::propertyNameValidator,propertyName._M_dataplus._M_p);
      if (bVar4) {
        if (target == (cmGeneratorTarget *)0x0) {
          __assert_fail("target",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                        ,0x516,
                        "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                       );
        }
        bVar4 = std::operator==(&propertyName,"LINKER_LANGUAGE");
        if (!bVar4) {
          std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr(&local_1d8,
                       (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *
                       )context);
          pcVar10 = target;
          std::__cxx11::string::string((string *)&local_50,(string *)&propertyName);
          cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                    (&dagChecker,(cmListFileBacktrace *)&local_1d8,pcVar10,&local_50,content,
                     dagCheckerParent);
          std::__cxx11::string::~string((string *)&local_50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
          RVar5 = cmGeneratorExpressionDAGChecker::Check(&dagChecker);
          if (RVar5 == SELF_REFERENCE) {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                      (&linkedTargetsContent,content);
            cmGeneratorExpressionDAGChecker::ReportError(&dagChecker,context,&linkedTargetsContent);
LAB_002f95a4:
            std::__cxx11::string::~string((string *)&linkedTargetsContent);
LAB_002f95ae:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
          else {
            if (RVar5 == CYCLIC_REFERENCE) goto LAB_002f95ae;
            if (RVar5 == ALREADY_SEEN) {
              lVar9 = 1;
              do {
                if (lVar9 == 0xb) goto LAB_002f9436;
                bVar4 = std::operator==(targetPropertyTransitiveWhitelist[lVar9],&propertyName);
                lVar9 = lVar9 + 1;
              } while (!bVar4);
              goto LAB_002f95ae;
            }
LAB_002f9436:
            local_1e0 = cmGeneratorTarget::GetProperty(target,&propertyName);
            if (((dagCheckerParent != (cmGeneratorExpressionDAGChecker *)0x0) &&
                (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression
                                   (dagCheckerParent), !bVar4)) &&
               (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(dagCheckerParent),
               !bVar4)) {
              bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                (dagCheckerParent,(cmGeneratorTarget *)0x0);
              if (bVar4) {
                bVar4 = std::operator==("INCLUDE_DIRECTORIES",&propertyName);
                if ((((((bVar4) ||
                       (bVar4 = std::operator==("INTERFACE_INCLUDE_DIRECTORIES",&propertyName),
                       bVar4)) ||
                      ((bVar4 = std::operator==("SYSTEM_INCLUDE_DIRECTORIES",&propertyName), bVar4
                       || ((bVar4 = std::operator==("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                                    &propertyName), bVar4 ||
                           (bVar4 = std::operator==("COMPILE_DEFINITIONS",&propertyName), bVar4)))))
                      ) || (bVar4 = std::operator==("INTERFACE_COMPILE_DEFINITIONS",&propertyName),
                           bVar4)) ||
                    ((((((bVar4 = std::operator==("COMPILE_OPTIONS",&propertyName), bVar4 ||
                         (bVar4 = std::operator==("INTERFACE_COMPILE_OPTIONS",&propertyName), bVar4)
                         ) || (bVar4 = std::operator==("AUTOUIC_OPTIONS",&propertyName), bVar4)) ||
                       ((bVar4 = std::operator==("INTERFACE_AUTOUIC_OPTIONS",&propertyName), bVar4
                        || (bVar4 = std::operator==("SOURCES",&propertyName), bVar4)))) ||
                      (bVar4 = std::operator==("INTERFACE_SOURCES",&propertyName), bVar4)) ||
                     ((bVar4 = std::operator==("COMPILE_FEATURES",&propertyName), bVar4 ||
                      (bVar4 = std::operator==("INTERFACE_COMPILE_FEATURES",&propertyName), bVar4)))
                     ))) || (((bVar4 = std::operator==("LINK_OPTIONS",&propertyName), bVar4 ||
                              (((bVar4 = std::operator==("INTERFACE_LINK_OPTIONS",&propertyName),
                                bVar4 || (bVar4 = std::operator==("LINK_DIRECTORIES",&propertyName),
                                         bVar4)) ||
                               (bVar4 = std::operator==("INTERFACE_LINK_DIRECTORIES",&propertyName),
                               bVar4)))) ||
                             ((bVar4 = std::operator==("LINK_DEPENDS",&propertyName), bVar4 ||
                              (bVar4 = std::operator==("INTERFACE_LINK_DEPENDS",&propertyName),
                              bVar4)))))) {
                  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                            (&linkedTargetsContent,content);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&interfacePropertyName,
                             "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                             ,(allocator<char> *)&local_200);
                  reportError(context,&linkedTargetsContent,&interfacePropertyName);
                  std::__cxx11::string::~string((string *)&interfacePropertyName);
                  goto LAB_002f95a4;
                }
                if (local_1e0 == (char *)0x0) goto LAB_002f95ae;
              }
              else {
                bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories
                                  (dagCheckerParent);
                if ((((!bVar4) &&
                     (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                        (dagCheckerParent), !bVar4)) &&
                    ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions
                                        (dagCheckerParent), !bVar4 &&
                     (((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions
                                          (dagCheckerParent), !bVar4 &&
                       (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                          (dagCheckerParent), !bVar4)) &&
                      (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent),
                      !bVar4)))))) &&
                   (((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                        (dagCheckerParent), !bVar4 &&
                     (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions
                                        (dagCheckerParent), !bVar4)) &&
                    ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                        (dagCheckerParent), !bVar4 &&
                     (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends
                                        (dagCheckerParent), !bVar4)))))) {
                  __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                ,0x556,
                                "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                               );
                }
              }
            }
            paVar1 = &linkedTargetsContent.field_2;
            linkedTargetsContent._M_string_length = 0;
            linkedTargetsContent.field_2._M_local_buf[0] = '\0';
            interfacePropertyName._M_dataplus._M_p = (pointer)&interfacePropertyName.field_2;
            interfacePropertyName._M_string_length = 0;
            interfacePropertyName.field_2._M_local_buf[0] = '\0';
            linkedTargetsContent._M_dataplus._M_p = (pointer)paVar1;
            bVar4 = std::operator==(&propertyName,"INCLUDE_DIRECTORIES");
            if (bVar4) {
LAB_002f94b9:
              std::__cxx11::string::assign((char *)&interfacePropertyName);
              bVar4 = false;
            }
            else {
              bVar4 = std::operator==(&propertyName,"INTERFACE_INCLUDE_DIRECTORIES");
              if (bVar4) {
LAB_002f95df:
                bVar4 = true;
                std::__cxx11::string::assign((char *)&interfacePropertyName);
              }
              else {
                bVar4 = std::operator==(&propertyName,"SYSTEM_INCLUDE_DIRECTORIES");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
                if (bVar4) goto LAB_002f95df;
                bVar4 = std::operator==(&propertyName,"COMPILE_DEFINITIONS");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_COMPILE_DEFINITIONS");
                if (bVar4) goto LAB_002f95df;
                bVar4 = std::operator==(&propertyName,"COMPILE_OPTIONS");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_COMPILE_OPTIONS");
                if (bVar4) goto LAB_002f95df;
                bVar4 = std::operator==(&propertyName,"AUTOUIC_OPTIONS");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_AUTOUIC_OPTIONS");
                if (bVar4) goto LAB_002f95df;
                bVar4 = std::operator==(&propertyName,"SOURCES");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_SOURCES");
                if (bVar4) goto LAB_002f95df;
                bVar4 = std::operator==(&propertyName,"COMPILE_FEATURES");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_COMPILE_FEATURES");
                if (bVar4) goto LAB_002f95df;
                bVar4 = std::operator==(&propertyName,"LINK_OPTIONS");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_LINK_OPTIONS");
                if (bVar4) goto LAB_002f95df;
                bVar4 = std::operator==(&propertyName,"LINK_DIRECTORIES");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_LINK_DIRECTORIES");
                if (bVar4) goto LAB_002f95df;
                bVar4 = std::operator==(&propertyName,"LINK_DEPENDS");
                if (bVar4) goto LAB_002f94b9;
                bVar4 = std::operator==(&propertyName,"INTERFACE_LINK_DEPENDS");
                if (bVar4) goto LAB_002f95df;
                bVar4 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                                  (&propertyName,(char (*) [21])"COMPILE_DEFINITIONS_");
                if ((bVar4) &&
                   (PVar8 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar8 < NEW)) {
                  std::__cxx11::string::assign((char *)&interfacePropertyName);
                }
                bVar4 = false;
              }
            }
            pcVar10 = target;
            head = context->HeadTarget;
            if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
              head = target;
            }
            if (bVar4) {
              libraries = cmGeneratorTarget::GetLinkInterfaceLibraries
                                    (target,&context->Config,head,true);
              pcVar10 = head;
              if (libraries != (cmLinkInterfaceLibraries *)0x0) {
                getLinkedTargetsContent<cmLinkItem>
                          (&local_200,&libraries->Libraries,target,head,context,&dagChecker,
                           &interfacePropertyName);
LAB_002f9699:
                std::__cxx11::string::operator=
                          ((string *)&linkedTargetsContent,(string *)&local_200);
                std::__cxx11::string::~string((string *)&local_200);
              }
            }
            else if ((interfacePropertyName._M_string_length != 0) &&
                    (libraries_00 = cmGeneratorTarget::GetLinkImplementationLibraries
                                              (target,&context->Config),
                    libraries_00 != (cmLinkImplementationLibraries *)0x0)) {
              getLinkedTargetsContent<cmLinkImplItem>
                        (&local_200,&libraries_00->Libraries,target,target,context,&dagChecker,
                         &interfacePropertyName);
              goto LAB_002f9699;
            }
            if (local_1e0 == (char *)0x0) {
              bVar4 = cmGeneratorTarget::IsImported(target);
              if ((bVar4) ||
                 (TVar6 = cmGeneratorTarget::GetType(target), TVar6 == INTERFACE_LIBRARY)) {
LAB_002f97c2:
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)linkedTargetsContent._M_dataplus._M_p == paVar1) {
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_,
                                linkedTargetsContent.field_2._M_local_buf[0]);
                  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                       linkedTargetsContent.field_2._8_8_;
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p = linkedTargetsContent._M_dataplus._M_p
                  ;
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_,
                                linkedTargetsContent.field_2._M_local_buf[0]);
                }
                __return_storage_ptr__->_M_string_length = linkedTargetsContent._M_string_length;
                linkedTargetsContent._M_string_length = 0;
                linkedTargetsContent.field_2._M_local_buf[0] = '\0';
                linkedTargetsContent._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                psVar11 = &context->Config;
                bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                  (target,&propertyName,psVar11);
                if (bVar4) {
                  context->HadContextSensitiveCondition = true;
                  bVar4 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                    (target,&propertyName,psVar11);
                  pcVar15 = "0";
                  if (bVar4) {
                    pcVar15 = "1";
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,pcVar15,(allocator<char> *)&local_200)
                  ;
                }
                else {
                  bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                    (target,&propertyName,psVar11);
                  if (bVar4) {
                    context->HadContextSensitiveCondition = true;
                    pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                        (target,&propertyName,psVar11);
                    pcVar15 = "";
                    if (pcVar13 != (char *)0x0) {
                      pcVar15 = pcVar13;
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,pcVar15,
                               (allocator<char> *)&local_200);
                  }
                  else {
                    bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                      (target,&propertyName,psVar11);
                    if (bVar4) {
                      context->HadContextSensitiveCondition = true;
                      pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                          (target,&propertyName,psVar11);
                      pcVar15 = "";
                      if (pcVar13 != (char *)0x0) {
                        pcVar15 = pcVar13;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,pcVar15,
                                 (allocator<char> *)&local_200);
                    }
                    else {
                      bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                        (target,&propertyName,psVar11);
                      if (!bVar4) goto LAB_002f97c2;
                      context->HadContextSensitiveCondition = true;
                      pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                          (target,&propertyName,psVar11);
                      pcVar15 = "";
                      if (pcVar13 != (char *)0x0) {
                        pcVar15 = pcVar13;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,pcVar15,
                                 (allocator<char> *)&local_200);
                    }
                  }
                }
              }
            }
            else {
              bVar4 = cmGeneratorTarget::IsImported(target);
              if ((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0 || bVar4) ||
                 (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                    (dagCheckerParent,(cmGeneratorTarget *)0x0), bVar4)) {
LAB_002f96f3:
                if (interfacePropertyName._M_string_length == 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,local_1e0,
                             (allocator<char> *)&local_200);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_200,local_1e0,&local_201);
                  cmGeneratorExpressionNode::EvaluateDependentExpression
                            (__return_storage_ptr__,&local_200,context->LG,context,pcVar10,target,
                             &dagChecker);
                  std::__cxx11::string::~string((string *)&local_200);
                  if (linkedTargetsContent._M_string_length != 0) {
                    pcVar15 = ";";
                    if (__return_storage_ptr__->_M_string_length == 0) {
                      pcVar15 = "";
                    }
                    std::operator+(&local_200,pcVar15,&linkedTargetsContent);
                    std::__cxx11::string::append((string *)__return_storage_ptr__);
                    std::__cxx11::string::~string((string *)&local_200);
                  }
                }
              }
              else {
                psVar11 = &context->Config;
                bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                  (target,&propertyName,psVar11);
                if (bVar4) {
                  context->HadContextSensitiveCondition = true;
                  pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                      (target,&propertyName,psVar11);
                  pcVar15 = "";
                  if (pcVar13 != (char *)0x0) {
                    pcVar15 = pcVar13;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,pcVar15,(allocator<char> *)&local_200)
                  ;
                }
                else {
                  bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                    (target,&propertyName,psVar11);
                  if (!bVar4) goto LAB_002f96f3;
                  context->HadContextSensitiveCondition = true;
                  pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                      (target,&propertyName,psVar11);
                  pcVar15 = "";
                  if (pcVar13 != (char *)0x0) {
                    pcVar15 = pcVar13;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,pcVar15,(allocator<char> *)&local_200)
                  ;
                }
              }
            }
            std::__cxx11::string::~string((string *)&interfacePropertyName);
            std::__cxx11::string::~string((string *)&linkedTargetsContent);
          }
          cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
          goto LAB_002f9b41;
        }
        bVar4 = cmGeneratorTarget::LinkLanguagePropagatesToDependents(target);
        if ((!bVar4 || dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
           ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                               (dagCheckerParent,(cmGeneratorTarget *)0x0), !bVar4 &&
            (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), !bVar4)))
           ) {
          cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,target,&context->Config);
          goto LAB_002f9b41;
        }
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&linkedTargetsContent,
                   "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                   ,(allocator<char> *)&interfacePropertyName);
        reportError(context,(string *)&dagChecker,&linkedTargetsContent);
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&linkedTargetsContent,"Property name not supported.",
                   (allocator<char> *)&interfacePropertyName);
        reportError(context,(string *)&dagChecker,&linkedTargetsContent);
      }
    }
  }
  std::__cxx11::string::~string((string *)&linkedTargetsContent);
  std::__cxx11::string::~string((string *)&dagChecker);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_002f9b41:
  std::__cxx11::string::~string((string *)&propertyName);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    if (parameters.size() != 1 && parameters.size() != 2) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = context->HeadTarget;
    std::string propertyName = parameters.front();

    if (parameters.size() == 1) {
      context->HadHeadSensitiveCondition = true;
    }
    if (!target && parameters.size() == 1) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
        "It may not be used with add_custom_command or add_custom_target.  "
        "Specify the target to read a property from using the "
        "$<TARGET_PROPERTY:tgt,prop> signature instead.");
      return std::string();
    }

    if (parameters.size() == 2) {
      if (parameters.front().empty() && parameters[1].empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name and property name.");
        return std::string();
      }
      if (parameters.front().empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name.");
        return std::string();
      }

      std::string targetName = parameters.front();
      propertyName = parameters[1];
      if (!cmGeneratorExpression::IsValidTargetName(targetName)) {
        if (!propertyNameValidator.find(propertyName)) {
          ::reportError(context, content->GetOriginalExpression(),
                        "Target name and property name not supported.");
          return std::string();
        }
        ::reportError(context, content->GetOriginalExpression(),
                      "Target name not supported.");
        return std::string();
      }
      static const std::string propALIASED_TARGET = "ALIASED_TARGET";
      if (propertyName == propALIASED_TARGET) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return "";
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);
    }

    if (target == context->HeadTarget) {
      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);
    }
    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        for (size_t i = 1; i < cm::size(targetPropertyTransitiveWhitelist);
             ++i) {
          if (targetPropertyTransitiveWhitelist[i] == propertyName) {
            // No error. We're not going to find anything new here.
            return std::string();
          }
        }
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    const char* prop = target->GetProperty(propertyName);

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY)                                 \
  (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(
              TRANSITIVE_PROPERTY_COMPARE) false) { // NOLINT(*)
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
#undef TRANSITIVE_PROPERTY_COMPARE

        if (!prop) {
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||

        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
      context->HeadTarget && isInterfaceProperty ? context->HeadTarget
                                                 : target;

    if (isInterfaceProperty) {
      if (cmLinkInterfaceLibraries const* iface =
            target->GetLinkInterfaceLibraries(context->Config, headTarget,
                                              true)) {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target, headTarget,
                                  context, &dagChecker, interfacePropertyName);
      }
    } else if (!interfacePropertyName.empty()) {
      if (cmLinkImplementationLibraries const* impl =
            target->GetLinkImplementationLibraries(context->Config)) {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target, target, context,
                                  &dagChecker, interfacePropertyName);
      }
    }

    if (!prop) {
      if (target->IsImported() ||
          target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        return linkedTargetsContent;
      }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }

      return linkedTargetsContent;
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }
    if (!interfacePropertyName.empty()) {
      std::string result = this->EvaluateDependentExpression(
        prop, context->LG, context, headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
      return result;
    }
    return prop;
  }